

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketCompression.cpp
# Opt level: O3

void __thiscall
tonk::MessageDecompressor::InsertUncompressed(MessageDecompressor *this,uint8_t *data,uint bytes)

{
  uint *puVar1;
  uint uVar2;
  uint8_t *__dest;
  
  if (bytes <= this->MaxCompressedMessagesBytes) {
    uVar2 = (this->History).NextWriteOffset;
    if (24000 < this->MaxCompressedMessagesBytes + uVar2) {
      uVar2 = 0;
      (this->History).NextWriteOffset = 0;
    }
    __dest = (this->History).Buffer + uVar2;
    memcpy(__dest,data,(ulong)bytes);
    ZSTD_insertBlock(this->DCtx,__dest,(ulong)bytes);
    puVar1 = &(this->History).NextWriteOffset;
    *puVar1 = *puVar1 + bytes;
  }
  return;
}

Assistant:

void MessageDecompressor::InsertUncompressed(
    const uint8_t* data,
    unsigned bytes)
{
    if (bytes > MaxCompressedMessagesBytes) {
        TONK_DEBUG_BREAK(); // Invalid input
        return;
    }

    void* history = History.Allocate(MaxCompressedMessagesBytes);
    memcpy(history, data, bytes);
    ZSTD_insertBlock(DCtx, history, bytes);
    History.Commit(bytes);
}